

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void __thiscall QString::QString(QString *this,qsizetype size,QChar ch)

{
  char16_t *pcVar1;
  long in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  char16_t *e;
  char16_t *b;
  char16_t value;
  char16_t *in_stack_ffffffffffffff78;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff88;
  qsizetype in_stack_ffffffffffffff90;
  qsizetype in_stack_ffffffffffffff98;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffffa0;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char16_t>::QArrayDataPointer(in_RDI);
  if (in_RSI < 1) {
    QArrayDataPointer<char16_t>::fromRawData
              ((char16_t *)in_stack_ffffffffffffff88,(qsizetype)in_RDI);
    QArrayDataPointer<char16_t>::operator=(in_stack_ffffffffffffff88,in_RDI);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    QArrayDataPointer<char16_t>::operator=(in_stack_ffffffffffffff88,in_RDI);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    pcVar1 = QArrayDataPointer<char16_t>::data(in_RDI);
    if (pcVar1 == (char16_t *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        qBadAlloc();
      }
      goto LAB_0050818c;
    }
    pcVar1 = QArrayDataPointer<char16_t>::data(in_RDI);
    pcVar1[in_RSI] = L'\0';
    QArrayDataPointer<char16_t>::data(in_RDI);
    QArrayDataPointer<char16_t>::data(in_RDI);
    QChar::unicode(&local_a);
    std::fill<char16_t*,char16_t>((char16_t *)in_RDI,in_stack_ffffffffffffff78,L"ëë䡤ҋ⠥");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0050818c:
  __stack_chk_fail();
}

Assistant:

QString::QString(qsizetype size, QChar ch)
{
    if (size <= 0) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        d = DataPointer(size, size);
        Q_CHECK_PTR(d.data());
        d.data()[size] = '\0';
        char16_t *b = d.data();
        char16_t *e = d.data() + size;
        const char16_t value = ch.unicode();
        std::fill(b, e, value);
    }
}